

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

bool __thiscall RenX::Server::removeCommand(Server *this,string_view trigger)

{
  char cVar1;
  pointer puVar2;
  long lVar3;
  
  puVar2 = (this->m_commands).
           super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (this->m_commands).
                super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    lVar3 = -(long)puVar2;
    do {
      cVar1 = Jupiter::Command::matches
                        ((puVar2->_M_t).
                         super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                         .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl,
                         trigger._M_len,trigger._M_str);
      if (cVar1 != '\0') {
        std::
        vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
        ::_M_erase(&this->m_commands,
                   (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)-lVar3)
        ;
        return true;
      }
      puVar2 = puVar2 + 1;
      lVar3 = lVar3 + -8;
    } while (puVar2 != (this->m_commands).
                       super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return false;
}

Assistant:

bool RenX::Server::isCratesEnabled() const {
	return m_spawnCrates;
}